

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env.cc
# Opt level: O3

Status __thiscall leveldb::ReadFileToString(leveldb *this,Env *env,string *fname,string *data)

{
  void *pvVar1;
  void *pvVar2;
  void *pvVar3;
  long in_FS_OFFSET;
  Slice fragment;
  SequentialFile *file;
  void *local_58;
  char *local_50;
  size_type local_48;
  long *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  data->_M_string_length = 0;
  *(data->_M_dataplus)._M_p = '\0';
  (*env->_vptr_Env[2])();
  if (*(long *)this == 0) {
    pvVar2 = operator_new__(0x2000);
    do {
      local_50 = "";
      local_48 = 0;
      (**(code **)(*local_40 + 0x10))(&local_58,local_40,0x2000,&local_50,pvVar2);
      pvVar1 = *(void **)this;
      *(void **)this = local_58;
      pvVar3 = local_58;
      local_58 = pvVar1;
      if (pvVar1 != (void *)0x0) {
        operator_delete__(pvVar1);
        pvVar3 = *(void **)this;
      }
      if (pvVar3 != (void *)0x0) break;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (data,local_50,local_48);
    } while (local_48 != 0);
    operator_delete__(pvVar2);
    if (local_40 != (long *)0x0) {
      (**(code **)(*local_40 + 8))();
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (Status)(char *)this;
  }
  __stack_chk_fail();
}

Assistant:

Status ReadFileToString(Env* env, const std::string& fname, std::string* data) {
  data->clear();
  SequentialFile* file;
  Status s = env->NewSequentialFile(fname, &file);
  if (!s.ok()) {
    return s;
  }
  static const int kBufferSize = 8192;
  char* space = new char[kBufferSize];
  while (true) {
    Slice fragment;
    s = file->Read(kBufferSize, &fragment, space);
    if (!s.ok()) {
      break;
    }
    data->append(fragment.data(), fragment.size());
    if (fragment.empty()) {
      break;
    }
  }
  delete[] space;
  delete file;
  return s;
}